

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFileDB.cpp
# Opt level: O0

void __thiscall ObjectFileDB::process_labels(ObjectFileDB *this)

{
  ObjectFileDB *in_stack_00000018;
  uint32_t total;
  Timer process_label_timer;
  
  printf("- Processing Labels...\n");
  Timer::Timer((Timer *)0x19360b);
  for_each_obj<ObjectFileDB::process_labels()::__0>
            (in_stack_00000018,(anon_class_8_1_a8b0ca64)process_label_timer._startTime.tv_sec);
  printf("Processed Labels:\n");
  printf(" total %d labels\n",0);
  Timer::getMs((Timer *)0x193656);
  printf(" total %.3f ms\n");
  printf("\n");
  return;
}

Assistant:

void ObjectFileDB::process_labels() {
  printf("- Processing Labels...\n");
  Timer process_label_timer;
  uint32_t total = 0;
  for_each_obj([&](ObjectFileData& obj) { total += obj.linked_data.set_ordered_label_names(); });

  printf("Processed Labels:\n");
  printf(" total %d labels\n", total);
  printf(" total %.3f ms\n", process_label_timer.getMs());
  printf("\n");
}